

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O2

AggregateFunction * duckdb::GetSumAggregateNoOverflowDecimal(void)

{
  AggregateFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_59;
  LogicalType local_58 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LogicalType(local_28,DECIMAL);
  __l._M_len = 1;
  __l._M_array = local_28;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_59);
  duckdb::LogicalType::LogicalType(local_58,DECIMAL);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_40,local_58,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,DEFAULT_NULL_HANDLING,(aggregate_simple_update_t)0x0,
             SumNoOverflowBind,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(local_58);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  duckdb::LogicalType::~LogicalType(local_28);
  in_RDI->serialize = SumNoOverflowSerialize;
  in_RDI->deserialize = SumNoOverflowDeserialize;
  return in_RDI;
}

Assistant:

AggregateFunction GetSumAggregateNoOverflowDecimal() {
	AggregateFunction aggr({LogicalTypeId::DECIMAL}, LogicalTypeId::DECIMAL, nullptr, nullptr, nullptr, nullptr,
	                       nullptr, FunctionNullHandling::DEFAULT_NULL_HANDLING, nullptr, SumNoOverflowBind);
	aggr.serialize = SumNoOverflowSerialize;
	aggr.deserialize = SumNoOverflowDeserialize;
	return aggr;
}